

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O1

void __thiscall Oric::VideoOutput::run_for(VideoOutput *this,Cycles cycles)

{
  InputDataType IVar1;
  uint32_t uVar2;
  ScanTarget *pSVar3;
  uint8_t *puVar4;
  uint32_t *puVar5;
  byte bVar6;
  int iVar7;
  undefined4 extraout_var;
  byte bVar8;
  byte bVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  byte bVar16;
  uint uVar17;
  bool bVar18;
  uint8_t colours [2];
  uint32_t colours_1 [2];
  byte local_4a [2];
  uint32_t local_48 [2];
  CRT *local_40;
  uint8_t **local_38;
  
  if ((int)cycles.super_WrappedInt<Cycles>.length_ != 0) {
    local_40 = &this->crt_;
    local_38 = &this->rgb_pixel_target_;
    do {
      uVar17 = this->counter_;
      iVar11 = SUB84(cycles.super_WrappedInt<Cycles>.length_,0);
      iVar7 = iVar11;
      if (((int)uVar17 < this->v_sync_start_position_) ||
         (iVar14 = this->v_sync_end_position_, iVar14 <= (int)uVar17)) {
        uVar12 = uVar17 & 0x3f;
        if (uVar12 < 0x28 && (int)uVar17 < 0x3800) {
          if (uVar12 == 0) {
            this->ink_ = '\a';
            this->paper_ = '\0';
            this->blink_text_ = false;
            this->use_alternative_character_set_ = false;
            this->use_double_height_characters_ = false;
            if (this->is_graphics_mode_ == true) {
              this->character_set_base_address_ = 0x9800;
            }
            else {
              this->character_set_base_address_ = 0xb400;
            }
            IVar1 = this->data_type_;
            pSVar3 = (this->crt_).scan_target_;
            iVar7 = (*pSVar3->_vptr_ScanTarget[5])(pSVar3,0xf0,1);
            (this->crt_).allocated_data_length_ = -(ulong)(CONCAT44(extraout_var,iVar7) == 0) | 0xf0
            ;
            *(long *)((long)(&this->frequency_mismatch_warner_ + 1) +
                     (ulong)(IVar1 != Red1Green1Blue1) * 8 + 0x18) = CONCAT44(extraout_var,iVar7);
            if (this->counter_ == 0) {
              this->frame_counter_ = this->frame_counter_ + 1;
              bVar18 = this->next_frame_is_sixty_hertz_ != false;
              iVar7 = 0x4000;
              if (bVar18) {
                iVar7 = 0x3a80;
              }
              this->v_sync_start_position_ = iVar7;
              iVar7 = 0x40c0;
              if (bVar18) {
                iVar7 = 0x3b80;
              }
              this->v_sync_end_position_ = iVar7;
              iVar7 = 0x4e00;
              if (bVar18) {
                iVar7 = 0x4180;
              }
              this->counter_period_ = iVar7;
            }
          }
          iVar7 = 0x28 - uVar12;
          if (iVar11 < (int)(0x28 - uVar12)) {
            iVar7 = iVar11;
          }
          bVar6 = (((uint)this->frame_counter_ >> 5 & 1) != 0) - 1;
          if (this->blink_text_ == false) {
            bVar6 = 0xff;
          }
          if (iVar7 != 0) {
            uVar17 = uVar17 & 0x3f;
            lVar10 = (long)((this->counter_ >> 9) * 0x28) + (ulong)uVar17 + 48000;
            lVar13 = (long)((this->counter_ >> 6) * 0x28) + (ulong)uVar17 + 0xa000;
            iVar14 = 0;
            do {
              puVar4 = this->ram_;
              if ((this->counter_ < 0x3200 & this->is_graphics_mode_) == 1) {
                bVar16 = puVar4[lVar13];
                uVar12 = (uint)bVar16;
              }
              else {
                uVar12 = (uint)puVar4[lVar10];
                bVar16 = puVar4[(int)((uVar12 & 0x7f) * 8 + this->character_set_base_address_ +
                                     ((uint)this->counter_ >>
                                      (this->use_double_height_characters_ & 0x1fU | 6) & 7))];
              }
              bVar8 = (byte)uVar12;
              bVar9 = (char)bVar8 >> 7 & 7;
              if ((uVar12 & 0x60) == 0) {
                switch(uVar12 & 0x1f) {
                case 0:
                  this->ink_ = '\0';
                  break;
                case 1:
                  this->ink_ = '\x04';
                  break;
                case 2:
                  this->ink_ = '\x02';
                  break;
                case 3:
                  this->ink_ = '\x06';
                  break;
                case 4:
                  this->ink_ = '\x01';
                  break;
                case 5:
                  this->ink_ = '\x05';
                  break;
                case 6:
                  this->ink_ = '\x03';
                  break;
                case 7:
                  this->ink_ = '\a';
                  break;
                default:
                  this->use_alternative_character_set_ = (bool)(bVar8 & 1);
                  this->use_double_height_characters_ = (bool)(bVar8 >> 1 & 1);
                  this->blink_text_ = (bool)(bVar8 >> 2 & 1);
                  if (this->is_graphics_mode_ == false) {
                    iVar15 = (uVar12 & 1) * 0x400 + 0xb400;
                  }
                  else {
                    iVar15 = (uVar12 & 1 | 0x26) << 10;
                  }
                  this->character_set_base_address_ = iVar15;
                  break;
                case 0x10:
                  this->paper_ = '\0';
                  break;
                case 0x11:
                  this->paper_ = '\x04';
                  break;
                case 0x12:
                  this->paper_ = '\x02';
                  break;
                case 0x13:
                  this->paper_ = '\x06';
                  break;
                case 0x14:
                  this->paper_ = '\x01';
                  break;
                case 0x15:
                  this->paper_ = '\x05';
                  break;
                case 0x16:
                  this->paper_ = '\x03';
                  break;
                case 0x17:
                  this->paper_ = '\a';
                  break;
                case 0x18:
                case 0x19:
                case 0x1a:
                case 0x1b:
                case 0x1c:
                case 0x1d:
                case 0x1e:
                case 0x1f:
                  this->is_graphics_mode_ = (bool)(bVar8 >> 2 & 1);
                  this->next_frame_is_sixty_hertz_ = (uVar12 & 2) == 0;
                }
                if ((this->data_type_ == Red1Green1Blue1) &&
                   (this->rgb_pixel_target_ != (uint8_t *)0x0)) {
                  bVar9 = bVar9 ^ this->paper_;
                  this->rgb_pixel_target_[5] = bVar9;
                  this->rgb_pixel_target_[4] = bVar9;
                  this->rgb_pixel_target_[3] = bVar9;
                  this->rgb_pixel_target_[2] = bVar9;
                  this->rgb_pixel_target_[1] = bVar9;
                  *this->rgb_pixel_target_ = bVar9;
                }
                else {
                  puVar5 = this->composite_pixel_target_;
                  if (puVar5 != (uint32_t *)0x0) {
                    uVar2 = this->colour_forms_[bVar9 ^ this->paper_];
                    puVar5[5] = uVar2;
                    puVar5[4] = uVar2;
                    puVar5[3] = uVar2;
                    puVar5[2] = uVar2;
                    puVar5[1] = uVar2;
                    *puVar5 = uVar2;
                  }
                }
              }
              else {
                bVar16 = bVar16 & bVar6;
                if ((this->data_type_ == Red1Green1Blue1) &&
                   (this->rgb_pixel_target_ != (byte *)0x0)) {
                  local_4a[0] = this->paper_ ^ bVar9;
                  local_4a[1] = bVar9 ^ this->ink_;
                  *this->rgb_pixel_target_ = local_4a[(bVar16 >> 5 & 1) != 0];
                  this->rgb_pixel_target_[1] = local_4a[(bVar16 >> 4 & 1) != 0];
                  this->rgb_pixel_target_[2] = local_4a[(bVar16 >> 3 & 1) != 0];
                  this->rgb_pixel_target_[3] = local_4a[(bVar16 >> 2 & 1) != 0];
                  this->rgb_pixel_target_[4] = local_4a[(bVar16 >> 1 & 1) != 0];
                  this->rgb_pixel_target_[5] = local_4a[bVar16 & 1];
                }
                else {
                  puVar5 = this->composite_pixel_target_;
                  if (puVar5 != (uint32_t *)0x0) {
                    local_48[0] = this->colour_forms_[this->paper_ ^ bVar9];
                    local_48[1] = this->colour_forms_[bVar9 ^ this->ink_];
                    *puVar5 = *(uint32_t *)((long)local_48 + (ulong)(bVar16 >> 3 & 4));
                    puVar5[1] = *(uint32_t *)((long)local_48 + (ulong)(bVar16 >> 2 & 4));
                    uVar12 = (uint)bVar16;
                    puVar5[2] = *(uint32_t *)((long)local_48 + (ulong)(bVar16 >> 1 & 4));
                    puVar5[3] = *(uint32_t *)((long)local_48 + (ulong)(uVar12 & 4));
                    puVar5[4] = *(uint32_t *)((long)local_48 + (ulong)(uVar12 & 2) * 2);
                    puVar5[5] = local_48[uVar12 & 1];
                  }
                }
              }
              if (this->rgb_pixel_target_ != (uint8_t *)0x0) {
                this->rgb_pixel_target_ = this->rgb_pixel_target_ + 6;
              }
              if (this->composite_pixel_target_ != (uint32_t *)0x0) {
                this->composite_pixel_target_ = this->composite_pixel_target_ + 6;
              }
              lVar10 = lVar10 + 1;
              lVar13 = lVar13 + 1;
              iVar14 = iVar14 + -1;
            } while (-iVar7 != iVar14);
            uVar12 = uVar17 - iVar14;
          }
          if (uVar12 == 0x28) {
            Outputs::CRT::CRT::output_data(local_40,0xf0,0xf0);
            *local_38 = (uint8_t *)0x0;
            local_38[1] = (uint8_t *)0x0;
          }
        }
        else if (uVar12 < 0x30) {
          iVar14 = 0x30 - uVar12;
          if (iVar14 <= iVar11) {
            iVar7 = 0x120;
            if ((int)uVar17 < 0x3800) {
              iVar7 = 0x30;
            }
LAB_003870d5:
            Outputs::CRT::CRT::output_blank(local_40,iVar7);
            iVar7 = iVar14;
          }
        }
        else if (uVar12 < 0x36) {
          if ((int)(0x36 - uVar12) <= iVar11) {
            Outputs::CRT::CRT::output_sync(local_40,0x24);
            iVar7 = 0x36 - uVar12;
          }
        }
        else if (uVar12 < 0x38) {
          if ((int)(0x38 - uVar12) <= iVar11) {
            Outputs::CRT::CRT::output_default_colour_burst(local_40,0xc,')');
            iVar7 = 0x38 - uVar12;
          }
        }
        else {
          iVar14 = 0x40 - uVar12;
          if (iVar14 <= iVar11) {
            iVar7 = 0x30;
            goto LAB_003870d5;
          }
        }
      }
      else if ((int)(iVar14 - uVar17) <= iVar11) {
        Outputs::CRT::CRT::output_sync(local_40,(iVar14 - this->v_sync_start_position_) * 6);
        iVar7 = iVar14 - uVar17;
      }
      this->counter_ = (this->counter_ + iVar7) % this->counter_period_;
      cycles.super_WrappedInt<Cycles>.length_ = (WrappedInt<Cycles>)(ulong)(uint)(iVar11 - iVar7);
    } while (iVar11 - iVar7 != 0);
  }
  return;
}

Assistant:

void VideoOutput::run_for(const Cycles cycles) {
	// Horizontal: 0-39: pixels; otherwise blank; 48-53 sync, 54-56 colour burst.
	// Vertical: 0-223: pixels; otherwise blank; 256-259 (50Hz) or 234-238 (60Hz) sync.

#define clamp(action)	\
	if(cycles_run_for <= number_of_cycles) { action; } else cycles_run_for = number_of_cycles;

	int number_of_cycles = int(cycles.as_integral());
	while(number_of_cycles) {
		int h_counter = counter_ & 63;
		int cycles_run_for = 0;

		if(counter_ >= v_sync_start_position_ && counter_ < v_sync_end_position_) {
			// this is a sync line
			cycles_run_for = v_sync_end_position_ - counter_;
			clamp(crt_.output_sync((v_sync_end_position_ - v_sync_start_position_) * 6));
		} else if(counter_ < 224*64 && h_counter < 40) {
			// this is a pixel line
			if(!h_counter) {
				ink_ = 0x7;
				paper_ = 0x0;
				use_alternative_character_set_ = use_double_height_characters_ = blink_text_ = false;
				set_character_set_base_address();

				if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1) {
					rgb_pixel_target_ = reinterpret_cast<uint8_t *>(crt_.begin_data(240));
				} else {
					composite_pixel_target_ = reinterpret_cast<uint32_t *>(crt_.begin_data(240));
				}

				if(!counter_) {
					frame_counter_++;

					v_sync_start_position_ = next_frame_is_sixty_hertz_ ? PAL60VSyncStartPosition : PAL50VSyncStartPosition;
					v_sync_end_position_ = next_frame_is_sixty_hertz_ ? PAL60VSyncEndPosition : PAL50VSyncEndPosition;
					counter_period_ = next_frame_is_sixty_hertz_ ? PAL60Period : PAL50Period;
				}
			}

			cycles_run_for = std::min(40 - h_counter, number_of_cycles);
			int columns = cycles_run_for;
			int pixel_base_address = 0xa000 + (counter_ >> 6) * 40;
			int character_base_address = 0xbb80 + (counter_ >> 9) * 40;
			const uint8_t blink_mask = (blink_text_ && (frame_counter_&32)) ? 0x00 : 0xff;

			while(columns--) {
				uint8_t pixels, control_byte;

				if(is_graphics_mode_ && counter_ < 200*64) {
					control_byte = pixels = ram_[pixel_base_address + h_counter];
				} else {
					int address = character_base_address + h_counter;
					control_byte = ram_[address];
					const int line = use_double_height_characters_ ? ((counter_ >> 7) & 7) : ((counter_ >> 6) & 7);
					pixels = ram_[character_set_base_address_ + (control_byte&127) * 8 + line];
				}

				const uint8_t inverse_mask = (control_byte & 0x80) ? 0x7 : 0x0;
				pixels &= blink_mask;

				if(control_byte & 0x60) {
					if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1 && rgb_pixel_target_) {
						const uint8_t colours[2] = {
							uint8_t(paper_ ^ inverse_mask),
							uint8_t(ink_ ^ inverse_mask)
						};
						rgb_pixel_target_[0] = colours[(pixels >> 5)&1];
						rgb_pixel_target_[1] = colours[(pixels >> 4)&1];
						rgb_pixel_target_[2] = colours[(pixels >> 3)&1];
						rgb_pixel_target_[3] = colours[(pixels >> 2)&1];
						rgb_pixel_target_[4] = colours[(pixels >> 1)&1];
						rgb_pixel_target_[5] = colours[(pixels >> 0)&1];
					} else if(composite_pixel_target_) {
						const uint32_t colours[2] = {
							colour_forms_[paper_ ^ inverse_mask],
							colour_forms_[ink_ ^ inverse_mask]
						};
						composite_pixel_target_[0] = colours[(pixels >> 5)&1];
						composite_pixel_target_[1] = colours[(pixels >> 4)&1];
						composite_pixel_target_[2] = colours[(pixels >> 3)&1];
						composite_pixel_target_[3] = colours[(pixels >> 2)&1];
						composite_pixel_target_[4] = colours[(pixels >> 1)&1];
						composite_pixel_target_[5] = colours[(pixels >> 0)&1];
					}
				} else {
					switch(control_byte & 0x1f) {
						case 0x00:		ink_ = 0x0;	break;
						case 0x01:		ink_ = 0x4;	break;
						case 0x02:		ink_ = 0x2;	break;
						case 0x03:		ink_ = 0x6;	break;
						case 0x04:		ink_ = 0x1;	break;
						case 0x05:		ink_ = 0x5;	break;
						case 0x06:		ink_ = 0x3;	break;
						case 0x07:		ink_ = 0x7;	break;

						case 0x08:	case 0x09:	case 0x0a: case 0x0b:
						case 0x0c:	case 0x0d:	case 0x0e: case 0x0f:
							use_alternative_character_set_ = (control_byte&1);
							use_double_height_characters_ = (control_byte&2);
							blink_text_ = (control_byte&4);
							set_character_set_base_address();
						break;

						case 0x10:		paper_ = 0x0;	break;
						case 0x11:		paper_ = 0x4;	break;
						case 0x12:		paper_ = 0x2;	break;
						case 0x13:		paper_ = 0x6;	break;
						case 0x14:		paper_ = 0x1;	break;
						case 0x15:		paper_ = 0x5;	break;
						case 0x16:		paper_ = 0x3;	break;
						case 0x17:		paper_ = 0x7;	break;

						case 0x18: case 0x19: case 0x1a: case 0x1b:
						case 0x1c: case 0x1d: case 0x1e: case 0x1f:
							is_graphics_mode_ = (control_byte & 4);
							next_frame_is_sixty_hertz_ = !(control_byte & 2);
						break;

						default: break;
					}

					if(data_type_ == Outputs::Display::InputDataType::Red1Green1Blue1 && rgb_pixel_target_) {
						rgb_pixel_target_[0] = rgb_pixel_target_[1] =
						rgb_pixel_target_[2] = rgb_pixel_target_[3] =
						rgb_pixel_target_[4] = rgb_pixel_target_[5] = paper_ ^ inverse_mask;
					} else if(composite_pixel_target_) {
						composite_pixel_target_[0] = composite_pixel_target_[1] =
						composite_pixel_target_[2] = composite_pixel_target_[3] =
						composite_pixel_target_[4] = composite_pixel_target_[5] = colour_forms_[paper_ ^ inverse_mask];
					}
				}
				if(rgb_pixel_target_) rgb_pixel_target_ += 6;
				if(composite_pixel_target_) composite_pixel_target_ += 6;
				h_counter++;
			}

			if(h_counter == 40) {
				crt_.output_data(40 * 6);
				rgb_pixel_target_ = nullptr;
				composite_pixel_target_ = nullptr;
			}
		} else {
			// this is a blank line (or the equivalent part of a pixel line)
			if(h_counter < 48) {
				cycles_run_for = 48 - h_counter;
				clamp(
					int period = (counter_ < 224*64) ? 8 : 48;
					crt_.output_blank(period * 6);
				);
			} else if(h_counter < 54) {
				cycles_run_for = 54 - h_counter;
				clamp(crt_.output_sync(6 * 6));
			} else if(h_counter < 56) {
				cycles_run_for = 56 - h_counter;
				clamp(crt_.output_default_colour_burst(2 * 6));
			} else {
				cycles_run_for = 64 - h_counter;
				clamp(crt_.output_blank(8 * 6));
			}
		}

		counter_ = (counter_ + cycles_run_for)%counter_period_;
		number_of_cycles -= cycles_run_for;
	}
}